

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

ctmbstr prvTidyEntityName(uint ch,uint versions)

{
  char *pcVar1;
  entity *peVar2;
  
  pcVar1 = "AElig";
  peVar2 = entities;
  while ((peVar2 = peVar2 + 1, peVar2[-1].code != ch || ((peVar2[-1].versions & versions) == 0))) {
    pcVar1 = peVar2->name;
    if (pcVar1 == (ctmbstr)0x0) {
      return (ctmbstr)0x0;
    }
  }
  return pcVar1;
}

Assistant:

ctmbstr TY_(EntityName)( uint ch, uint versions )
{
    ctmbstr entnam = NULL;
    const entity *ep;

    for ( ep = entities; ep->name != NULL; ++ep )
    {
        if ( ep->code == ch )
        {
            if (ep->versions & versions)
            {
                entnam = ep->name;
                break; /* Issue #643 - Found code and version. Stop search? */
            }
        }
    }
    return entnam;
}